

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Expression> __thiscall minja::Parser::parseValueExpression(Parser *this)

{
  _Atomic_word *p_Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
  *ppVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  Parser *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  pointer pbVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  runtime_error *prVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  Expression *__tmp;
  char *pcVar17;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
  *ppVar20;
  Parser *in_RSI;
  element_type *peVar21;
  char *pcVar22;
  shared_ptr<minja::Expression> sVar23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  Location location;
  shared_ptr<minja::VariableExpr> identifier;
  shared_ptr<minja::Expression> slice_start;
  shared_ptr<minja::Expression> slice_end;
  anon_class_8_1_8991fb9c parseValue;
  allocator_type local_f9;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Parser *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  undefined1 local_90 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
  *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
  local_78;
  _func_int **local_48;
  _func_int **local_40;
  
  local_c0 = this;
  parseValueExpression::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
  pcVar17 = (in_RSI->end)._M_current;
  pcVar22 = (in_RSI->it)._M_current;
  if (pcVar22 != pcVar17) {
    local_48 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00270d68;
    local_78.second.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR___Sp_counted_ptr_inplace_00270c30;
    local_40 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00270cc0;
LAB_001ee87f:
    do {
      peVar21 = (element_type *)(local_a8 + 0x10);
      iVar12 = isspace((int)*pcVar22);
      if (iVar12 != 0) {
        pcVar22 = pcVar22 + 1;
        (in_RSI->it)._M_current = pcVar22;
        if (pcVar22 != pcVar17) goto LAB_001ee87f;
      }
      local_a8._0_8_ = peVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"[","");
      local_88 = &local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,".","");
      __l._M_len = 2;
      __l._M_array = (iterator)local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f8,__l,(allocator_type *)local_d8._M_local_buf);
      bVar10 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      lVar18 = -0x40;
      ppVar20 = &local_78;
      do {
        ppVar2 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
                  *)ppVar20[-1].second.
                    super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (ppVar20 != ppVar2) {
          operator_delete(ppVar2,(ulong)((ppVar20->first)._M_dataplus._M_p + 1));
        }
        ppVar20 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
                   *)&ppVar20[-1].first.field_2;
        lVar18 = lVar18 + 0x20;
      } while (lVar18 != 0);
      if (!bVar10) break;
      pbVar13 = (pointer)(local_f8 + 0x10);
      local_f8._0_8_ = pbVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"[","");
      consumeToken((string *)local_a8,in_RSI,(string *)local_f8,Strip);
      uVar6 = local_a8._8_8_;
      if ((element_type *)local_a8._0_8_ != peVar21) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
      }
      if ((pointer)local_f8._0_8_ != pbVar13) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_f8._0_8_ = pbVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,".","");
        consumeToken((string *)local_a8,in_RSI,(string *)local_f8,Strip);
        uVar6 = local_a8._8_8_;
        if ((element_type *)local_a8._0_8_ != peVar21) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        if ((pointer)local_f8._0_8_ != pbVar13) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          parseIdentifier((Parser *)&local_d8);
          if ((element_type *)local_d8._M_allocated_capacity == (element_type *)0x0) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar15,"Expected identifier in subscript");
            __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pcVar17 = (in_RSI->end)._M_current;
          pcVar22 = (in_RSI->it)._M_current;
          while ((pcVar22 != pcVar17 && (iVar12 = isspace((int)*pcVar22), iVar12 != 0))) {
            pcVar22 = pcVar22 + 1;
            (in_RSI->it)._M_current = pcVar22;
          }
          local_a8._0_8_ = peVar21;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"(","");
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_a8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f8,__l_00,(allocator_type *)local_b8);
          bVar10 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f8);
          if ((element_type *)local_a8._0_8_ != peVar21) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
          }
          uVar6 = local_d8._M_allocated_capacity;
          if (bVar10) {
            parseCallArgs((ArgumentsExpression *)local_a8,in_RSI);
            uVar6 = local_d8._M_allocated_capacity;
            p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
            pPVar7 = local_c0;
            p_Var14->_M_use_count = 1;
            p_Var14->_M_weak_count = 1;
            p_Var14->_vptr__Sp_counted_base = local_48;
            MethodCallExpr::MethodCallExpr
                      ((MethodCallExpr *)(p_Var14 + 1),(Location *)(uVar6 + 8),
                       (shared_ptr<minja::Expression> *)local_c0,
                       (shared_ptr<minja::VariableExpr> *)&local_d8,(ArgumentsExpression *)local_a8)
            ;
            (pPVar7->template_str).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)(p_Var14 + 1);
            p_Var5 = (pPVar7->template_str).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (pPVar7->template_str).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var14;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                       *)local_90);
            std::
            vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
            ::~vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                       *)local_a8);
          }
          else {
            local_f8._0_8_ = local_f8 + 0x10;
            peVar3 = (((shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>_>
                        *)(local_d8._M_allocated_capacity + 0x20))->
                     super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f8,peVar3,
                       (long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              (local_d8._M_allocated_capacity + 0x28))->_M_pi->
                              _vptr__Sp_counted_base + (long)peVar3);
            Value::Value((Value *)local_a8,(string *)local_f8);
            local_b8._0_8_ = (LiteralExpr *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<minja::LiteralExpr,std::allocator<minja::LiteralExpr>,minja::Location&,minja::Value>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                       (LiteralExpr **)local_b8,(allocator<minja::LiteralExpr> *)&local_f9,
                       (Location *)(uVar6 + 8),(Value *)local_a8);
            paVar19 = &local_78.first.field_2;
            nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)paVar19,false);
            nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)paVar19);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.first._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_78.first._M_string_length);
            }
            if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
            }
            if (local_90 != (undefined1  [8])0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = (_Atomic_word *)(local_a8._8_8_ + 0xc);
                iVar12 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar12 = *(_Atomic_word *)(local_a8._8_8_ + 0xc);
                *(int *)(local_a8._8_8_ + 0xc) = iVar12 + -1;
              }
              if (iVar12 == 1) {
                (**(code **)(*(long *)local_a8._8_8_ + 0x18))();
              }
            }
            if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
            }
            pPVar7 = local_c0;
            local_a8._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<minja::SubscriptExpr,std::allocator<minja::SubscriptExpr>,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::LiteralExpr>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                       (SubscriptExpr **)local_a8,(allocator<minja::SubscriptExpr> *)local_f8,
                       (Location *)(local_d8._M_allocated_capacity + 8),
                       (shared_ptr<minja::Expression> *)local_c0,
                       (shared_ptr<minja::LiteralExpr> *)local_b8);
            uVar8 = local_a8._8_8_;
            uVar6 = local_a8._0_8_;
            local_a8._0_8_ = (element_type *)0x0;
            local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (pPVar7->template_str).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (pPVar7->template_str).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar6;
            (pPVar7->template_str).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
            if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
            }
            if ((pointer)local_b8._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
            }
          }
          goto joined_r0x001ef151;
        }
      }
      else {
        local_d8._M_allocated_capacity = 0;
        local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8._0_8_ = pbVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,":","");
        consumeToken((string *)local_a8,in_RSI,(string *)local_f8,Strip);
        uVar6 = local_a8._8_8_;
        if ((element_type *)local_a8._0_8_ != peVar21) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        if ((pointer)local_f8._0_8_ != pbVar13) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        bVar10 = SUB81(in_RSI,0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          parseExpression((Parser *)local_b8,bVar10);
          local_f8._0_8_ = pbVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,":","");
          consumeToken((string *)local_a8,in_RSI,(string *)local_f8,Strip);
          uVar6 = local_a8._8_8_;
          if ((element_type *)local_a8._0_8_ != peVar21) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
          }
          if ((pointer)local_f8._0_8_ != pbVar13) {
            operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
          }
          uVar9 = local_b8._8_8_;
          uVar8 = local_b8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_b8._0_8_ = (LiteralExpr *)0x0;
            local_b8._8_8_ = (pointer)0x0;
            local_d8._M_allocated_capacity = uVar8;
            uVar6 = local_d8._8_8_;
joined_r0x001eeedd:
            local_d8._8_8_ = uVar9;
            pbVar13 = (pointer)local_b8._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
              pbVar13 = (pointer)local_b8._8_8_;
            }
          }
          else {
            pcVar17 = (in_RSI->end)._M_current;
            pcVar22 = (in_RSI->it)._M_current;
            while ((pcVar22 != pcVar17 && (iVar12 = isspace((int)*pcVar22), iVar12 != 0))) {
              pcVar22 = pcVar22 + 1;
              (in_RSI->it)._M_current = pcVar22;
            }
            local_a8._0_8_ = peVar21;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"]","");
            __l_01._M_len = 1;
            __l_01._M_array = (iterator)local_a8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8,__l_01,&local_f9);
            bVar11 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_f8);
            if ((element_type *)local_a8._0_8_ != peVar21) {
              operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
            }
            if (bVar11) {
              local_f8._0_8_ = (pointer)0x0;
              local_a8._0_8_ = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<minja::SliceExpr,std::allocator<minja::SliceExpr>,minja::Location&,std::shared_ptr<minja::Expression>,decltype(nullptr)>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                         (SliceExpr **)local_a8,(allocator<minja::SliceExpr> *)&local_f9,
                         &((Expression *)local_b8._0_8_)->location,
                         (shared_ptr<minja::Expression> *)local_b8,(void **)local_f8);
              uVar8 = local_a8._8_8_;
              local_d8._M_allocated_capacity = local_a8._0_8_;
              uVar6 = local_d8._8_8_;
              local_a8._0_8_ = (element_type *)0x0;
              local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_d8._8_8_ = uVar8;
              pbVar13 = (pointer)local_b8._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
                uVar9 = local_d8._8_8_;
                uVar6 = local_a8._8_8_;
                goto joined_r0x001eeedd;
              }
            }
            else {
              parseExpression((Parser *)local_a8,bVar10);
              uVar6 = local_b8._0_8_;
              pbVar13 = (pointer)operator_new(0x50);
              pbVar13->_M_string_length = 0x100000001;
              (pbVar13->_M_dataplus)._M_p =
                   (pointer)local_78.second.
                            super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              paVar19 = &pbVar13->field_2;
              SliceExpr::SliceExpr
                        ((SliceExpr *)paVar19,&((Expression *)uVar6)->location,
                         (shared_ptr<minja::Expression> *)local_b8,
                         (shared_ptr<minja::Expression> *)local_a8);
              uVar6 = local_d8._8_8_;
              bVar10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_d8._M_allocated_capacity = (size_type)paVar19;
              local_d8._8_8_ = pbVar13;
              if (bVar10) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
              }
              pbVar13 = (pointer)local_b8._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
                pbVar13 = (pointer)local_b8._8_8_;
              }
            }
          }
        }
        else {
          parseExpression((Parser *)local_a8,bVar10);
          local_b8._0_8_ = (LiteralExpr *)0x0;
          local_f8._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<minja::SliceExpr,std::allocator<minja::SliceExpr>,minja::Location&,decltype(nullptr),std::shared_ptr<minja::Expression>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),
                     (SliceExpr **)local_f8,(allocator<minja::SliceExpr> *)&local_f9,
                     (Location *)(local_a8._0_8_ + 8),(void **)local_b8,
                     (shared_ptr<minja::Expression> *)local_a8);
          uVar6 = local_d8._8_8_;
          local_d8._8_8_ = local_f8._8_8_;
          local_d8._M_allocated_capacity = local_f8._0_8_;
          local_f8._0_8_ = (pointer)0x0;
          local_f8._8_8_ = (pointer)0x0;
          pbVar13 = (pointer)local_a8._8_8_;
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6),
             pbVar13 = (pointer)local_a8._8_8_, (pointer)local_f8._8_8_ != (pointer)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
            pbVar13 = (pointer)local_a8._8_8_;
          }
        }
        if (pbVar13 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar13);
        }
        if ((element_type *)local_d8._M_allocated_capacity == (element_type *)0x0) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar15,"Empty index in subscript");
LAB_001ef2e5:
          __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_f8._0_8_ = (pointer)(local_f8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"]","");
        consumeToken((string *)local_a8,in_RSI,(string *)local_f8,Strip);
        uVar6 = local_a8._8_8_;
        if ((element_type *)local_a8._0_8_ != peVar21) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        pPVar7 = local_c0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6 ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar15,"Expected closing bracket in subscript");
          goto LAB_001ef2e5;
        }
        peVar4 = (local_c0->template_str).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var14->_M_use_count = 1;
        p_Var14->_M_weak_count = 1;
        p_Var14->_vptr__Sp_counted_base = local_40;
        SubscriptExpr::SubscriptExpr
                  ((SubscriptExpr *)(p_Var14 + 1),(Location *)&peVar4->_M_string_length,
                   (shared_ptr<minja::Expression> *)pPVar7,
                   (shared_ptr<minja::Expression> *)&local_d8);
        (pPVar7->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(p_Var14 + 1);
        p_Var5 = (pPVar7->template_str).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (pPVar7->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var14;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
joined_r0x001ef151:
        if ((pointer)local_d8._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
      }
      pcVar17 = (in_RSI->end)._M_current;
      pcVar22 = (in_RSI->it)._M_current;
      while ((pcVar22 != pcVar17 && (iVar12 = isspace((int)*pcVar22), iVar12 != 0))) {
        pcVar22 = pcVar22 + 1;
        (in_RSI->it)._M_current = pcVar22;
      }
    } while (pcVar22 != pcVar17);
  }
  local_a8._0_8_ = (element_type *)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"(","");
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f8,__l_02,(allocator_type *)local_d8._M_local_buf);
  bVar10 = peekSymbols(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  pPVar7 = local_c0;
  _Var16._M_pi = extraout_RDX;
  if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
    _Var16._M_pi = extraout_RDX_00;
  }
  if (bVar10) {
    local_f8._0_8_ =
         (in_RSI->template_str).
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_f8._8_8_ =
         (in_RSI->template_str).
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((pointer)local_f8._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((pointer)local_f8._8_8_)->_M_string_length =
             (int)((pointer)local_f8._8_8_)->_M_string_length + 1;
        UNLOCK();
      }
      else {
        *(int *)&((pointer)local_f8._8_8_)->_M_string_length =
             (int)((pointer)local_f8._8_8_)->_M_string_length + 1;
      }
    }
    local_f8._16_8_ = (in_RSI->it)._M_current + -(long)(in_RSI->start)._M_current;
    parseCallArgs((ArgumentsExpression *)local_a8,in_RSI);
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00270e18;
    CallExpr::CallExpr((CallExpr *)(p_Var14 + 1),(Location *)local_f8,
                       (shared_ptr<minja::Expression> *)pPVar7,(ArgumentsExpression *)local_a8);
    (pPVar7->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var14 + 1);
    p_Var5 = (pPVar7->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (pPVar7->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var14;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
               *)local_90);
    std::
    vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ::~vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
               *)local_a8);
    _Var16._M_pi = extraout_RDX_01;
    if ((pointer)local_f8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
      _Var16._M_pi = extraout_RDX_02;
    }
  }
  sVar23.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var16._M_pi;
  sVar23.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pPVar7;
  return (shared_ptr<minja::Expression>)
         sVar23.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseValueExpression() {
      auto parseValue = [&]() -> std::shared_ptr<Expression> {
        auto location = get_location();
        auto constant = parseConstant();
        if (constant) return std::make_shared<LiteralExpr>(location, *constant);

        static std::regex null_regex(R"(null\b)");
        if (!consumeToken(null_regex).empty()) return std::make_shared<LiteralExpr>(location, Value());

        auto identifier = parseIdentifier();
        if (identifier) return identifier;

        auto braced = parseBracedExpressionOrArray();
        if (braced) return braced;

        auto array = parseArray();
        if (array) return array;

        auto dictionary = parseDictionary();
        if (dictionary) return dictionary;

        throw std::runtime_error("Expected value expression");
      };

      auto value = parseValue();

      while (it != end && consumeSpaces() && peekSymbols({ "[", "." })) {
        if (!consumeToken("[").empty()) {
            std::shared_ptr<Expression> index;
            if (!consumeToken(":").empty()) {
              auto slice_end = parseExpression();
              index = std::make_shared<SliceExpr>(slice_end->location, nullptr, std::move(slice_end));
            } else {
              auto slice_start = parseExpression();
              if (!consumeToken(":").empty()) {
                consumeSpaces();
                if (peekSymbols({ "]" })) {
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), nullptr);
                } else {
                  auto slice_end = parseExpression();
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), std::move(slice_end));
                }
              } else {
                index = std::move(slice_start);
              }
            }
            if (!index) throw std::runtime_error("Empty index in subscript");
            if (consumeToken("]").empty()) throw std::runtime_error("Expected closing bracket in subscript");

            value = std::make_shared<SubscriptExpr>(value->location, std::move(value), std::move(index));
        } else if (!consumeToken(".").empty()) {
            auto identifier = parseIdentifier();
            if (!identifier) throw std::runtime_error("Expected identifier in subscript");

            consumeSpaces();
            if (peekSymbols({ "(" })) {
              auto callParams = parseCallArgs();
              value = std::make_shared<MethodCallExpr>(identifier->location, std::move(value), std::move(identifier), std::move(callParams));
            } else {
              auto key = std::make_shared<LiteralExpr>(identifier->location, Value(identifier->get_name()));
              value = std::make_shared<SubscriptExpr>(identifier->location, std::move(value), std::move(key));
            }
        }
        consumeSpaces();
      }

      if (peekSymbols({ "(" })) {
        auto location = get_location();
        auto callParams = parseCallArgs();
        value = std::make_shared<CallExpr>(location, std::move(value), std::move(callParams));
      }
      return value;
    }